

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_atomic_cmpxchg_i32_mips64el
               (TCGContext_conflict6 *tcg_ctx,TCGv_i32 retv,TCGv_i64 addr,TCGv_i32 cmpv,
               TCGv_i32 newv,TCGArg idx,MemOp_conflict2 memop)

{
  TCGTemp *pTVar1;
  TCGTemp *ts;
  TCGOp *pTVar2;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  
  switch(memop & MO_64) {
  case MO_8:
    memop = memop & ~MO_BE;
    break;
  case MO_32:
    memop = memop & ~MO_ASHIFT;
    break;
  case MO_64:
    tcg_gen_atomic_cmpxchg_i32_mips64el_cold_1();
  }
  if ((tcg_ctx->tb_cflags & 0x80000) == 0) {
    pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
    ts = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_ext_i32(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),cmpv,memop & MO_64);
    tcg_gen_qemu_ld_i32_mips64el(tcg_ctx,pTVar3,addr,idx,memop & ~MO_ASHIFT);
    pTVar2 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_movcond_i32);
    pTVar2->args[0] = (TCGArg)ts;
    pTVar2->args[1] = (TCGArg)pTVar1;
    pTVar2->args[2] = (TCGArg)ts;
    pTVar2->args[3] = (TCGArg)(newv + (long)tcg_ctx);
    pTVar2->args[4] = (TCGArg)pTVar1;
    pTVar2->args[5] = 8;
    tcg_gen_qemu_st_i32_mips64el(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),addr,idx,memop);
    tcg_temp_free_internal_mips64el(tcg_ctx,ts);
    if ((memop & MO_ASHIFT) == MO_8) {
      if (pTVar3 != retv) {
        pTVar2 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_mov_i32);
        pTVar2->args[0] = (TCGArg)(retv + (long)tcg_ctx);
        pTVar2->args[1] = (TCGArg)pTVar1;
      }
    }
    else {
      tcg_gen_ext_i32(tcg_ctx,retv,pTVar3,memop);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    return;
  }
  pTVar3 = tcg_const_i32_mips64el(tcg_ctx,(memop & 0xffffffb) << 4 | (uint)idx);
  (*(code *)table_cmpxchg[memop & MO_BEQ])(tcg_ctx,retv,tcg_ctx->cpu_env,addr,cmpv,newv,pTVar3);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  if ((memop & MO_ASHIFT) == MO_8) {
    return;
  }
  tcg_gen_ext_i32(tcg_ctx,retv,retv,memop);
  return;
}

Assistant:

void tcg_gen_atomic_cmpxchg_i32(TCGContext *tcg_ctx, TCGv_i32 retv, TCGv addr, TCGv_i32 cmpv,
                                TCGv_i32 newv, TCGArg idx, MemOp memop)
{
    memop = tcg_canonicalize_memop(memop, 0, 0);

    if (!(tcg_ctx->tb_cflags & CF_PARALLEL)) {
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_ext_i32(tcg_ctx, t2, cmpv, memop & MO_SIZE);

        tcg_gen_qemu_ld_i32(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, t2, t1, t2, newv, t1);
        tcg_gen_qemu_st_i32(tcg_ctx, t2, addr, idx, memop);
        tcg_temp_free_i32(tcg_ctx, t2);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i32(tcg_ctx, retv, t1, memop);
        } else {
            tcg_gen_mov_i32(tcg_ctx, retv, t1);
        }
        tcg_temp_free_i32(tcg_ctx, t1);
    } else {
        gen_atomic_cx_i32 gen;

        gen = table_cmpxchg[memop & (MO_SIZE | MO_BSWAP)];
        tcg_debug_assert(gen != NULL);

        {
            TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop & ~MO_SIGN, idx));
            gen(tcg_ctx, retv, tcg_ctx->cpu_env, addr, cmpv, newv, oi);
            tcg_temp_free_i32(tcg_ctx, oi);
        }

        if (memop & MO_SIGN) {
            tcg_gen_ext_i32(tcg_ctx, retv, retv, memop);
        }
    }
}